

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_seek(stb_vorbis *f,uint sample_number)

{
  int iVar1;
  int in_ESI;
  int *in_RDI;
  uint32 frame_start;
  int n;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = stb_vorbis_seek_frame
                    ((stb_vorbis *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if (in_ESI != in_RDI[0x160]) {
      iVar1 = in_RDI[0x160];
      stb_vorbis_get_frame_float
                ((stb_vorbis *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (float ***)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      in_RDI[0x1d9] = (in_ESI - iVar1) + in_RDI[0x1d9];
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int stb_vorbis_seek(stb_vorbis *f, unsigned int sample_number)
{
   if (!stb_vorbis_seek_frame(f, sample_number))
      return 0;

   if (sample_number != f->current_loc) {
      int n;
      uint32 frame_start = f->current_loc;
      stb_vorbis_get_frame_float(f, &n, NULL);
      assert(sample_number > frame_start);
      assert(f->channel_buffer_start + (int) (sample_number-frame_start) <= f->channel_buffer_end);
      f->channel_buffer_start += (sample_number - frame_start);
   }

   return 1;
}